

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::AbsCase::compare(AbsCase *this,void **inputs,void **outputs)

{
  float fVar1;
  DataType dataType;
  Precision PVar2;
  int iVar3;
  pointer pSVar4;
  uint uVar5;
  ulong uVar6;
  ostream *poVar7;
  int iVar8;
  ulong uVar9;
  deUint32 u32;
  HexFloat local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pSVar4 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar4->varType).m_data.basic.type;
  PVar2 = (pSVar4->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize(dataType);
  if (dataType - TYPE_FLOAT < 4) {
    uVar9 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar9;
    }
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      fVar1 = *(float *)((long)*inputs + uVar9 * 4);
      local_48 = -fVar1;
      if (-fVar1 <= fVar1) {
        local_48 = fVar1;
      }
      fVar1 = *(float *)((long)*outputs + uVar9 * 4);
      uVar5 = (int)local_48 - (int)fVar1;
      if ((uint)local_48 < (uint)fVar1) {
        uVar5 = -((int)local_48 - (int)fVar1);
      }
      if ((uint)~(-1 << (0x17 - (&DAT_01864fb8)[(ulong)PVar2 * 4] & 0x1f)) < uVar5) {
        uStack_44 = 0x80000000;
        uStack_40 = 0x80000000;
        uStack_3c = 0x80000000;
        poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
        poVar7 = std::operator<<(poVar7,"] = ");
        local_4c.value = local_48;
        poVar7 = Functional::operator<<(poVar7,&local_4c);
        poVar7 = std::operator<<(poVar7," with ULP threshold ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,", got ULP diff ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        return false;
      }
    }
  }
  else {
    uVar9 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar9;
    }
    for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      iVar3 = *(int *)((long)*inputs + uVar9 * 4);
      iVar8 = -iVar3;
      if (0 < iVar3) {
        iVar8 = iVar3;
      }
      if (*(int *)((long)*outputs + uVar9 * 4) != iVar8) {
        poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar9);
        poVar7 = std::operator<<(poVar7,"] = ");
        std::ostream::operator<<(poVar7,iVar8);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= (1u<<(23-mantissaBits))-1u;

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref0		= de::abs(in0);
				const deUint32	ulpDiff0	= getUlpDiff(out0, ref0);

				if (ulpDiff0 > maxUlpDiff)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " with ULP threshold " << maxUlpDiff << ", got ULP diff " << ulpDiff0;
					return false;
				}
			}
		}
		else
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int	in0		= ((const int*)inputs[0])[compNdx];
				const int	out0	= ((const int*)outputs[0])[compNdx];
				const int	ref0	= de::abs(in0);

				if (out0 != ref0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << ref0;
					return false;
				}
			}
		}

		return true;
	}